

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riffcpp.cpp
# Opt level: O3

FourCC __thiscall riffcpp::Chunk::type(Chunk *this)

{
  impl *piVar1;
  FourCC FVar2;
  FourCC read_type;
  _Type local_c;
  
  piVar1 = this->pimpl;
  std::istream::seekg((piVar1->m_stream).
                      super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,(piVar1->m_pos)._M_off + 8,(piVar1->m_pos)._M_state);
  std::istream::read((char *)(this->pimpl->m_stream).
                             super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,(long)local_c);
  FVar2._M_elems[0] = local_c[0];
  FVar2._M_elems[1] = local_c[1];
  FVar2._M_elems[2] = local_c[2];
  FVar2._M_elems[3] = local_c[3];
  return (FourCC)FVar2._M_elems;
}

Assistant:

riffcpp::FourCC riffcpp::Chunk::type() {
  std::streamoff offs{8};
  pimpl->m_stream->seekg(pimpl->m_pos + offs);
  riffcpp::FourCC read_type;
  pimpl->m_stream->read(read_type.data(), read_type.size());
  return read_type;
}